

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

shared_ptr<SchemeObject> __thiscall ExecutionResult::force_value(ExecutionResult *this)

{
  pointer pTVar1;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExecutionResult *in_RSI;
  shared_ptr<SchemeObject> sVar2;
  ExecutionResult local_38;
  ExecutionResult *this_local;
  
  this_local = this;
  while (in_RSI->type == TAIL_CALL) {
    pTVar1 = std::unique_ptr<TailContext,_std::default_delete<TailContext>_>::operator->
                       (&in_RSI->tail_context);
    this_00 = std::__shared_ptr_access<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)pTVar1);
    pTVar1 = std::unique_ptr<TailContext,_std::default_delete<TailContext>_>::operator->
                       (&in_RSI->tail_context);
    SchemeProcedure::execute(&local_38,this_00,&pTVar1->args);
    operator=(in_RSI,&local_38);
    ~ExecutionResult(&local_38);
  }
  std::shared_ptr<SchemeObject>::shared_ptr((shared_ptr<SchemeObject> *)this,&in_RSI->value);
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SchemeObject>)
         sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeObject> ExecutionResult::force_value()
{
    while(type == execution_result_t::TAIL_CALL)
    {
        (*this) = tail_context->func->execute(tail_context->args);
    }
    return value;
}